

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio_client>::pong
          (connection<websocketpp::config::asio_client> *this,string *payload,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  ostream *this_00;
  element_type *peVar3;
  size_t in_RCX;
  undefined8 extraout_RDX;
  error_code eVar4;
  byte local_341;
  error_code local_2d8;
  int local_2c8;
  error_category *local_2c0;
  undefined1 local_2b8 [64];
  dispatch_handler local_278;
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  local_258;
  lock_guard<std::mutex> local_248;
  scoped_lock_type lock_1;
  undefined1 local_238 [7];
  bool needs_writing;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_228;
  int local_218;
  undefined4 uStack_214;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  undefined1 local_208 [8];
  message_ptr msg;
  undefined4 uStack_1ec;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  lock_guard<std::mutex> local_28;
  scoped_lock_type lock;
  error_code *ec_local;
  string *payload_local;
  connection<websocketpp::config::asio_client> *this_local;
  
  lock._M_device = (mutex_type *)ec;
  peVar2 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_alog);
  bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                    (peVar2,0x400);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_alog);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,"connection pong",in_RCX);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_connection_state_lock);
  if (this->m_state == open) {
    msg.
    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    this_00 = std::operator<<(local_1a0,"connection::pong called from invalid state ");
    std::ostream::operator<<(this_00,this->m_state);
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_alog);
    std::__cxx11::stringstream::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,local_1e0,in_RCX);
    std::__cxx11::string::~string(local_1e0);
    eVar4 = websocketpp::error::make_error_code(invalid_state);
    ((lock._M_device)->super___mutex_base)._M_mutex.__align = CONCAT44(uStack_1ec,eVar4._M_value);
    *(error_category **)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8) = eVar4._M_cat;
    msg.
    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 1;
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  if (msg.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ == 0) {
    std::
    __shared_ptr_access<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_msg_manager);
    message_buffer::alloc::
    con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
    ::get_message((con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                   *)local_208);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_208);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<websocketpp::processor::processor<websocketpp::config::asio_client>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::processor::processor<websocketpp::config::asio_client>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_processor);
      std::
      shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
      ::shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                    *)local_238,
                   (shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                    *)local_208);
      local_228._M_allocated_capacity._0_4_ =
           (*peVar3->_vptr_processor[0x15])
                     (peVar3,payload,
                      (shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                       *)local_238);
      ((lock._M_device)->super___mutex_base)._M_mutex.__align =
           CONCAT44(local_228._M_allocated_capacity._4_4_,local_228._M_allocated_capacity._0_4_);
      *(undefined8 *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8) = extraout_RDX;
      std::
      shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
      ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                     *)local_238);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)lock._M_device);
      if (bVar1) {
        msg.
        super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = 1;
      }
      else {
        lock_1._M_device._7_1_ = 0;
        std::lock_guard<std::mutex>::lock_guard(&local_248,&this->m_write_lock);
        std::
        shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::shared_ptr(&local_258,
                     (shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                      *)local_208);
        write_push(this,&local_258);
        std::
        shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::~shared_ptr(&local_258);
        local_341 = 0;
        if ((this->m_write_flag & 1U) == 0) {
          bVar1 = std::
                  queue<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::deque<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>_>
                  ::empty(&this->m_send_queue);
          local_341 = bVar1 ^ 0xff;
        }
        lock_1._M_device._7_1_ = local_341 & 1;
        std::lock_guard<std::mutex>::~lock_guard(&local_248);
        if ((lock_1._M_device._7_1_ & 1) != 0) {
          local_2b8._16_8_ = write_frame;
          local_2b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          get_shared((connection<websocketpp::config::asio_client> *)local_2b8);
          std::
          bind<void(websocketpp::connection<websocketpp::config::asio_client>::*)(),std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>>>
                    ((type *)(local_2b8 + 0x20),
                     (offset_in_connection<websocketpp::config::asio_client>_to_subr *)
                     (local_2b8 + 0x10),
                     (shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_> *)
                     local_2b8);
          std::function<void()>::
          function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>>))()>,void>
                    ((function<void()> *)&local_278,
                     (_Bind<void_(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>))()>
                      *)(local_2b8 + 0x20));
          eVar4 = transport::asio::connection<websocketpp::config::asio_client::transport_config>::
                  dispatch(&this->super_transport_con_type,&local_278);
          local_2c0 = eVar4._M_cat;
          local_2c8 = eVar4._M_value;
          std::function<void_()>::~function(&local_278);
          std::
          _Bind<void_(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>))()>
          ::~_Bind((_Bind<void_(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>))()>
                    *)(local_2b8 + 0x20));
          std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>::~shared_ptr
                    ((shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_> *)
                     local_2b8);
        }
        std::error_code::error_code(&local_2d8);
        ((lock._M_device)->super___mutex_base)._M_mutex.__align = local_2d8._0_8_;
        *(error_category **)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8) =
             local_2d8._M_cat;
        msg.
        super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = 0;
      }
    }
    else {
      eVar4 = websocketpp::error::make_error_code(no_outgoing_buffers);
      local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar4._M_cat;
      local_218 = eVar4._M_value;
      ((lock._M_device)->super___mutex_base)._M_mutex.__align = CONCAT44(uStack_214,local_218);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8) = local_210._M_pi;
      msg.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 1;
    }
    std::
    shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
    ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                   *)local_208);
  }
  return;
}

Assistant:

void connection<config>::pong(std::string const& payload, lib::error_code& ec) {
    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"connection pong");
    }

    {
        scoped_lock_type lock(m_connection_state_lock);
        if (m_state != session::state::open) {
            std::stringstream ss;
            ss << "connection::pong called from invalid state " << m_state;
            m_alog->write(log::alevel::devel,ss.str());
            ec = error::make_error_code(error::invalid_state);
            return;
        }
    }

    message_ptr msg = m_msg_manager->get_message();
    if (!msg) {
        ec = error::make_error_code(error::no_outgoing_buffers);
        return;
    }

    ec = m_processor->prepare_pong(payload,msg);
    if (ec) {return;}

    bool needs_writing = false;
    {
        scoped_lock_type lock(m_write_lock);
        write_push(msg);
        needs_writing = !m_write_flag && !m_send_queue.empty();
    }

    if (needs_writing) {
        transport_con_type::dispatch(lib::bind(
            &type::write_frame,
            type::get_shared()
        ));
    }

    ec = lib::error_code();
}